

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsWellKnownMessage(FileDescriptor *file)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  string *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1e0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1d8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1cb;
  key_equal local_1ca;
  hasher local_1c9;
  undefined1 local_1c8;
  allocator local_1c7;
  allocator local_1c6;
  allocator local_1c5;
  allocator local_1c4;
  allocator local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  allocator local_1c0;
  allocator local_1bf;
  allocator local_1be;
  allocator local_1bd [20];
  allocator local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  FileDescriptor *file_local;
  
  local_10 = (undefined1  [8])file;
  if (IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::well_known_files_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                                 well_known_files_abi_cxx11_);
    if (iVar2 != 0) {
      local_1c8 = 1;
      local_1a8 = &local_1a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a0,"google/protobuf/any.proto",&local_1a9);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"google/protobuf/api.proto",local_1bd);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"google/protobuf/compiler/plugin.proto",&local_1be);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"google/protobuf/descriptor.proto",&local_1bf);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"google/protobuf/duration.proto",&local_1c0);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"google/protobuf/empty.proto",&local_1c1);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"google/protobuf/field_mask.proto",&local_1c2);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"google/protobuf/source_context.proto",&local_1c3);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"google/protobuf/struct.proto",&local_1c4);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"google/protobuf/timestamp.proto",&local_1c5);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"google/protobuf/type.proto",&local_1c6);
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"google/protobuf/wrappers.proto",&local_1c7);
      local_1c8 = 0;
      local_20 = &local_1a0;
      local_18 = 0xc;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_1cb);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                       well_known_files_abi_cxx11_,__l,0,&local_1c9,&local_1ca,&local_1cb);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_1cb);
      local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
      do {
        local_2b0 = local_2b0 + -1;
        std::__cxx11::string::~string((string *)local_2b0);
      } while (local_2b0 != &local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c7);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c6);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c5);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c4);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c3);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c2);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1bf);
      std::allocator<char>::~allocator((allocator<char> *)&local_1be);
      std::allocator<char>::~allocator((allocator<char> *)local_1bd);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                    well_known_files_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                           well_known_files_abi_cxx11_);
    }
  }
  __x = FileDescriptor::name_abi_cxx11_((FileDescriptor *)local_10);
  local_1d8._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
               well_known_files_abi_cxx11_,__x);
  local_1e0._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
              well_known_files_abi_cxx11_);
  bVar1 = std::__detail::operator!=(&local_1d8,&local_1e0);
  return bVar1;
}

Assistant:

bool IsWellKnownMessage(const FileDescriptor* file) {
  static const std::unordered_set<std::string> well_known_files{
      "google/protobuf/any.proto",
      "google/protobuf/api.proto",
      "google/protobuf/compiler/plugin.proto",
      "google/protobuf/descriptor.proto",
      "google/protobuf/duration.proto",
      "google/protobuf/empty.proto",
      "google/protobuf/field_mask.proto",
      "google/protobuf/source_context.proto",
      "google/protobuf/struct.proto",
      "google/protobuf/timestamp.proto",
      "google/protobuf/type.proto",
      "google/protobuf/wrappers.proto",
  };
  return well_known_files.find(file->name()) != well_known_files.end();
}